

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O0

vector<Color,_std::allocator<Color>_> * __thiscall
Face::get_layer(vector<Color,_std::allocator<Color>_> *__return_storage_ptr__,Face *this,
               Corner corner,int layer)

{
  pointer ppVar1;
  _Rb_tree_iterator<std::pair<const_Position,_Color_*>_> local_40;
  Corner local_34;
  undefined1 local_30 [4];
  int entry;
  Position to_access;
  int layer_local;
  Corner corner_local;
  Face *this_local;
  vector<Color,_std::allocator<Color>_> *desired_layer;
  
  to_access.layer._3_1_ = 0;
  to_access.entry = layer;
  std::vector<Color,_std::allocator<Color>_>::vector(__return_storage_ptr__);
  entry = to_access.entry;
  local_30 = (undefined1  [4])corner;
  for (local_34 = U; (int)local_34 < to_access.entry * 2 + 1; local_34 = local_34 + L) {
    to_access.reference_corner = local_34;
    local_40._M_node =
         (_Base_ptr)
         std::
         map<Position,_Color_*,_std::less<Position>,_std::allocator<std::pair<const_Position,_Color_*>_>_>
         ::find(&this->current_state,(key_type *)local_30);
    ppVar1 = std::_Rb_tree_iterator<std::pair<const_Position,_Color_*>_>::operator->(&local_40);
    std::vector<Color,_std::allocator<Color>_>::push_back(__return_storage_ptr__,ppVar1->second);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Color> Face::get_layer(Corner corner, int layer){
    std::vector<Color> desired_layer;
    Position to_access;
    to_access.layer =  layer;
    to_access.reference_corner = corner;
    for(int entry = 0; entry < 2*layer + 1; entry++){
        to_access.entry = entry;
        desired_layer.push_back(*current_state.find(to_access)->second);
    }
    return desired_layer;
}